

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::findPreviousFCDBoundary(Normalizer2Impl *this,UChar *start,UChar *p)

{
  uint16_t norm16_00;
  UChar *pUVar1;
  UBool UVar2;
  UChar *pUVar3;
  int local_4c;
  int local_3c;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UChar *codePointLimit;
  UChar *p_local;
  UChar *start_local;
  Normalizer2Impl *this_local;
  
  codePointLimit = p;
  while( true ) {
    pUVar1 = codePointLimit;
    if (codePointLimit <= start) {
      return codePointLimit;
    }
    pUVar3 = codePointLimit + -1;
    __index = (int32_t)(ushort)codePointLimit[-1];
    if ((__index & 0xfffff800U) == 0xd800) {
      if ((((codePointLimit[-1] & 0x400U) == 0) || (pUVar3 == start)) ||
         ((codePointLimit[-2] & 0xfc00U) != 0xd800)) {
        local_3c = this->normTrie->dataLength + -1;
        codePointLimit = pUVar3;
      }
      else {
        __index = (uint)(ushort)codePointLimit[-2] * 0x400 + __index + -0x35fdc00;
        if (__index < this->normTrie->highStart) {
          local_4c = ucptrie_internalSmallIndex_63(this->normTrie,__index);
        }
        else {
          local_4c = this->normTrie->dataLength + -2;
        }
        local_3c = local_4c;
        codePointLimit = codePointLimit + -2;
      }
    }
    else {
      local_3c = (uint)this->normTrie->index[__index >> 6] + (__index & 0x3fU);
      codePointLimit = pUVar3;
    }
    norm16_00 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_3c * 2);
    if ((__index < (int)(uint)(ushort)this->minDecompNoCP) ||
       (UVar2 = norm16HasDecompBoundaryAfter(this,norm16_00), UVar2 != '\0')) break;
    UVar2 = norm16HasDecompBoundaryBefore(this,norm16_00);
    if (UVar2 != '\0') {
      return codePointLimit;
    }
  }
  return pUVar1;
}

Assistant:

const UChar *Normalizer2Impl::findPreviousFCDBoundary(const UChar *start, const UChar *p) const {
    while(start<p) {
        const UChar *codePointLimit = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
        if (c < minDecompNoCP || norm16HasDecompBoundaryAfter(norm16)) {
            return codePointLimit;
        }
        if (norm16HasDecompBoundaryBefore(norm16)) {
            return p;
        }
    }
    return p;
}